

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O0

int * mbedtls_cipher_list(void)

{
  int *type;
  mbedtls_cipher_definition_t *def;
  
  if (supported_init == 0) {
    def = mbedtls_cipher_definitions;
    type = mbedtls_cipher_supported;
    while (def->type != MBEDTLS_CIPHER_NONE) {
      *type = def->type;
      type = type + 1;
      def = def + 1;
    }
    *type = 0;
    supported_init = 1;
  }
  return mbedtls_cipher_supported;
}

Assistant:

const int *mbedtls_cipher_list(void)
{
    const mbedtls_cipher_definition_t *def;
    int *type;

    if (!supported_init) {
        def = mbedtls_cipher_definitions;
        type = mbedtls_cipher_supported;

        while (def->type != 0) {
            *type++ = (*def++).type;
        }

        *type = 0;

        supported_init = 1;
    }

    return mbedtls_cipher_supported;
}